

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknetactivation.cpp
# Opt level: O2

int __thiscall
ncnn::DarknetActivation::forward_inplace(DarknetActivation *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  int i;
  ulong uVar2;
  int i_3;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  activate_op_lhtan<float> op;
  activate_op_lhtan<float> local_75;
  int local_74;
  Mat local_70;
  
  switch(this->activate_type) {
  case 2:
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar2 = 0;
    uVar3 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar3 = uVar2;
    }
    iVar6 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar6 = 0;
    }
    while (iVar5 = (int)uVar2, iVar5 != iVar6) {
      Mat::channel(&local_70,bottom_top_blob,iVar5);
      for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        fVar9 = *(float *)((long)local_70.data + uVar2 * 4);
        *(uint *)((long)local_70.data + uVar2 * 4) =
             ~-(uint)(0.0 < fVar9) & (uint)(fVar9 * 0.01) | (uint)fVar9 & -(uint)(0.0 < fVar9);
      }
      Mat::~Mat(&local_70);
      uVar2 = (ulong)(iVar5 + 1);
    }
    break;
  case 4:
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar2 = 0;
    uVar3 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar3 = uVar2;
    }
    iVar6 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar6 = 0;
    }
    while (iVar5 = (int)uVar2, iVar5 != iVar6) {
      Mat::channel(&local_70,bottom_top_blob,iVar5);
      for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        fVar9 = *(float *)((long)local_70.data + uVar2 * 4);
        fVar8 = fVar9;
        if (fVar9 <= 0.0) {
          fVar8 = 0.0;
        }
        *(float *)((long)local_70.data + uVar2 * 4) = fVar9 * 0.1 + fVar8;
      }
      Mat::~Mat(&local_70);
      uVar2 = (ulong)(iVar5 + 1);
    }
    break;
  case 6:
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar2 = 0;
    uVar3 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar3 = uVar2;
    }
    local_74 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_74 = 0;
    }
    while (iVar6 = (int)uVar2, iVar6 != local_74) {
      Mat::channel(&local_70,bottom_top_blob,iVar6);
      for (lVar7 = 0; uVar3 * 4 != lVar7; lVar7 = lVar7 + 4) {
        fVar9 = activate_op_plse<float>::operator()
                          ((activate_op_plse<float> *)&local_75,
                           (float *)((long)local_70.data + lVar7));
        *(float *)((long)local_70.data + lVar7) = fVar9;
      }
      Mat::~Mat(&local_70);
      uVar2 = (ulong)(iVar6 + 1);
    }
    break;
  case 9:
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar2 = 0;
    uVar3 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar3 = uVar2;
    }
    local_74 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_74 = 0;
    }
    while (iVar6 = (int)uVar2, iVar6 != local_74) {
      Mat::channel(&local_70,bottom_top_blob,iVar6);
      pvVar1 = local_70.data;
      for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        fVar9 = expf(-*(float *)((long)pvVar1 + uVar2 * 4));
        *(float *)((long)pvVar1 + uVar2 * 4) = 2.0 / (fVar9 + 1.0) + -1.0;
      }
      Mat::~Mat(&local_70);
      uVar2 = (ulong)(iVar6 + 1);
    }
    break;
  case 10:
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar2 = 0;
    uVar3 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar3 = uVar2;
    }
    local_74 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_74 = 0;
    }
    while (iVar6 = (int)uVar2, iVar6 != local_74) {
      Mat::channel(&local_70,bottom_top_blob,iVar6);
      for (lVar7 = 0; uVar3 * 4 != lVar7; lVar7 = lVar7 + 4) {
        fVar9 = activate_op_stair<float>::operator()
                          ((activate_op_stair<float> *)&local_75,
                           (float *)((long)local_70.data + lVar7));
        *(float *)((long)local_70.data + lVar7) = fVar9;
      }
      Mat::~Mat(&local_70);
      uVar2 = (ulong)(iVar6 + 1);
    }
    break;
  case 0xb:
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar2 = 0;
    uVar3 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar3 = uVar2;
    }
    iVar6 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar6 = 0;
    }
    while (iVar5 = (int)uVar2, iVar5 != iVar6) {
      Mat::channel(&local_70,bottom_top_blob,iVar5);
      for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        fVar9 = *(float *)((long)local_70.data + uVar2 * 4);
        if (1.0 <= fVar9) {
          fVar9 = 1.0;
        }
        if (fVar9 <= -1.0) {
          fVar9 = -1.0;
        }
        *(float *)((long)local_70.data + uVar2 * 4) = fVar9;
      }
      Mat::~Mat(&local_70);
      uVar2 = (ulong)(iVar5 + 1);
    }
    break;
  case 0xc:
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar2 = 0;
    uVar3 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar3 = uVar2;
    }
    local_74 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_74 = 0;
    }
    while (iVar6 = (int)uVar2, iVar6 != local_74) {
      Mat::channel(&local_70,bottom_top_blob,iVar6);
      for (lVar7 = 0; uVar3 * 4 != lVar7; lVar7 = lVar7 + 4) {
        fVar9 = activate_op_lhtan<float>::operator()
                          (&local_75,(float *)((long)local_70.data + lVar7));
        *(float *)((long)local_70.data + lVar7) = fVar9;
      }
      Mat::~Mat(&local_70);
      uVar2 = (ulong)(iVar6 + 1);
    }
  }
  return 0;
}

Assistant:

int DarknetActivation::forward_inplace(Mat &bottom_top_blob,
                                       const Option &opt) const
{
  if (activate_type == Activate_LINEAR)
    return 0;
  if (activate_type == Activate_RELIE)
    return activate_op_inplace< activate_op_relie<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_RAMP)
    return activate_op_inplace< activate_op_ramp<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_LOGGY)
    return activate_op_inplace <activate_op_loggy<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_PLSE)
    return activate_op_inplace< activate_op_plse<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_STAIR)
    return activate_op_inplace< activate_op_stair<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_HARDTAN)
    return activate_op_inplace< activate_op_hardtan<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_LHTAN)
    return activate_op_inplace< activate_op_lhtan<float> >(bottom_top_blob, opt);

  return 0;
}